

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O2

adh_node_t * hash_get_value(adh_weight_t weight,adh_order_t order)

{
  hash_entry_t *phVar1;
  adh_node_t *paVar2;
  adh_node_t *paVar3;
  uint uVar4;
  
  phVar1 = (hash_entry_t *)(map_weight_nodes.buckets + ((ulong)weight % 0x1eef - 1));
  paVar3 = (adh_node_t *)0x0;
  uVar4 = (uint)order;
  while (phVar1 = phVar1->next, phVar1 != (hash_entry_t *)0x0) {
    paVar2 = phVar1->value;
    if ((paVar2->weight == weight) &&
       (paVar2 != adh_root_node && (ushort)uVar4 < (ushort)*(uint *)&paVar2->order)) {
      paVar3 = paVar2;
      uVar4 = *(uint *)&paVar2->order;
    }
  }
  return paVar3;
}

Assistant:

adh_node_t* hash_get_value(adh_weight_t weight, adh_order_t order) {
    adh_node_t* node_result = NULL;
    int hash_index = hash_get_index(weight);
    hash_entry_t* entry = map_weight_nodes.buckets[hash_index];
    while(entry) {
        adh_node_t* current_node = entry->value;

        if(current_node->weight != weight) {
#ifdef _DEBUG
            collision++;
            hash_check_collision(weight, hash_index, current_node);
#endif
        }
        else if(current_node->order > order && current_node != adh_root_node) {
            node_result = current_node;
            order = node_result->order;
        }
        entry = entry->next;
    }
    return node_result;
}